

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadFunctionHeaders(WasmBinaryReader *this)

{
  uint uVar1;
  uint32 uVar2;
  uint bytesNeeded;
  uint sourceContextId;
  LocalFunctionId functionId;
  WasmFunctionInfo *this_00;
  char16_t *msg;
  WebAssemblyModule *this_01;
  FunctionBody *pFVar3;
  uint index;
  bool bVar4;
  FunctionBodyReaderInfo info;
  uint32 local_34 [2];
  uint32 len;
  
  uVar1 = LEB128<unsigned_int,32u>(this,local_34);
  this_01 = this->m_module;
  index = this_01->m_importedFunctionCount;
  uVar2 = Js::WebAssemblyModule::GetWasmFunctionCount(this_01);
  if (index <= uVar2) {
    this_01 = this->m_module;
    uVar2 = Js::WebAssemblyModule::GetWasmFunctionCount(this_01);
    if (uVar1 == uVar2 - index) {
      while( true ) {
        bVar4 = uVar1 == 0;
        uVar1 = uVar1 - 1;
        if (bVar4) {
          return;
        }
        this_00 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,index);
        this_01 = (WebAssemblyModule *)this;
        bytesNeeded = LEB128<unsigned_int,32u>(this,local_34);
        if ((0x74cbb1 < bytesNeeded) && (DAT_01430302 == '\0')) break;
        info.startOffset = (long)this->m_pc - (long)this->m_start;
        info._4_4_ = 0;
        info.size = bytesNeeded;
        WasmFunctionInfo::SetReaderInfo(this_00,info);
        CheckBytesLeft(this,bytesNeeded);
        pFVar3 = (this->m_funcState).body;
        if (pFVar3 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmReaderPhase);
        }
        else {
          sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar3);
          if (this->m_readerState == READER_STATE_FUNCTION) {
            pFVar3 = (this->m_funcState).body;
          }
          else {
            pFVar3 = (FunctionBody *)0x0;
          }
          functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar3);
          bVar4 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01453738,WasmReaderPhase,sourceContextId,functionId);
        }
        if (bVar4 != false) {
          Output::Print(L"Function body header: index = %u, size = %u",(ulong)index,
                        (ulong)bytesNeeded);
          Output::Print(L"\n");
          Output::Flush();
        }
        this->m_pc = this->m_pc + bytesNeeded;
        index = index + 1;
      }
      msg = L"Function body too big";
      goto LAB_00d6377e;
    }
  }
  msg = L"Function signatures and function bodies count mismatch";
LAB_00d6377e:
  ThrowDecodingError((WasmBinaryReader *)this_01,msg);
}

Assistant:

void WasmBinaryReader::ReadFunctionHeaders()
{
    uint32 len;
    uint32 entries = LEB128(len);
    uint32 importCount = m_module->GetImportedFunctionCount();
    if (m_module->GetWasmFunctionCount() < importCount ||
        entries != m_module->GetWasmFunctionCount() - importCount)
    {
        ThrowDecodingError(_u("Function signatures and function bodies count mismatch"));
    }

    for (uint32 i = 0; i < entries; ++i)
    {
        uint32 funcIndex = i + importCount;
        WasmFunctionInfo* funcInfo = m_module->GetWasmFunctionInfo(funcIndex);

        const uint32 funcSize = LEB128(len);
        if (funcSize > Limits::GetMaxFunctionSize())
        {
            ThrowDecodingError(_u("Function body too big"));
        }
        funcInfo->SetReaderInfo(FunctionBodyReaderInfo(funcSize, (m_pc - m_start)));
        CheckBytesLeft(funcSize);
        TRACE_WASM_DECODER(_u("Function body header: index = %u, size = %u"), funcIndex, funcSize);
        const byte* end = m_pc + funcSize;
        m_pc = end;
    }
}